

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O0

bool __thiscall
Assimp::ColladaLoader::CanRead(ColladaLoader *this,string *pFile,IOSystem *pIOHandler,bool checkSig)

{
  bool bVar1;
  byte bVar2;
  long lVar3;
  ZipArchiveIOSystem *zip_archive_00;
  bool local_b1;
  string local_b0;
  undefined1 local_90 [8];
  ZipArchiveIOSystem zip_archive;
  undefined1 local_50 [7];
  bool readSig;
  string extension;
  bool checkSig_local;
  IOSystem *pIOHandler_local;
  string *pFile_local;
  ColladaLoader *this_local;
  
  extension.field_2._M_local_buf[0xf] = checkSig;
  BaseImporter::GetExtension((string *)local_50,pFile);
  local_b1 = (extension.field_2._M_local_buf[0xf] & 1U) != 0 && pIOHandler != (IOSystem *)0x0;
  if ((local_b1) ||
     ((bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50,"dae"), !bVar1 &&
      (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               local_50,"zae"), !bVar1)))) {
    if (local_b1) {
      ZipArchiveIOSystem::ZipArchiveIOSystem((ZipArchiveIOSystem *)local_90,pIOHandler,pFile,"r");
      zip_archive.pImpl._0_1_ = ZipArchiveIOSystem::isOpen((ZipArchiveIOSystem *)local_90);
      if (zip_archive.pImpl._0_1_) {
        ColladaParser::ReadZaeManifest_abi_cxx11_
                  (&local_b0,(ColladaParser *)local_90,zip_archive_00);
        bVar2 = std::__cxx11::string::empty();
        this_local._7_1_ = (bVar2 ^ 0xff) & 1;
        std::__cxx11::string::~string((string *)&local_b0);
      }
      zip_archive.pImpl._1_3_ = 0;
      ZipArchiveIOSystem::~ZipArchiveIOSystem((ZipArchiveIOSystem *)local_90);
      if ((uint)zip_archive.pImpl != 0) goto LAB_00634ff5;
    }
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_50,"xml");
    if (((bVar1) || (lVar3 = std::__cxx11::string::length(), lVar3 == 0)) ||
       ((extension.field_2._M_local_buf[0xf] & 1U) != 0)) {
      if (pIOHandler == (IOSystem *)0x0) {
        this_local._7_1_ = 1;
        zip_archive.pImpl._0_4_ = 1;
      }
      else {
        this_local._7_1_ =
             BaseImporter::SearchFileHeaderForToken
                       (pIOHandler,pFile,CanRead::tokens,1,200,false,false);
        zip_archive.pImpl._0_4_ = 1;
      }
    }
    else {
      this_local._7_1_ = 0;
      zip_archive.pImpl._0_4_ = 1;
    }
  }
  else {
    this_local._7_1_ = 1;
    zip_archive.pImpl._0_4_ = 1;
  }
LAB_00634ff5:
  std::__cxx11::string::~string((string *)local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ColladaLoader::CanRead(const std::string& pFile, IOSystem* pIOHandler, bool checkSig) const {
    // check file extension
    const std::string extension = GetExtension(pFile);

    bool readSig = checkSig && (pIOHandler != nullptr);

    if (!readSig) {
        if (extension == "dae" || extension == "zae") {
            return true;
        }
    }

    if (readSig) {
        // Look for a DAE file inside, but don't extract it
        ZipArchiveIOSystem zip_archive(pIOHandler, pFile);
        if (zip_archive.isOpen())
            return !ColladaParser::ReadZaeManifest(zip_archive).empty();
    }

    // XML - too generic, we need to open the file and search for typical keywords
    if (extension == "xml" || !extension.length() || checkSig) {
        /*  If CanRead() is called in order to check whether we
         *  support a specific file extension in general pIOHandler
         *  might be NULL and it's our duty to return true here.
         */
        if (!pIOHandler) {
            return true;
        }
        static const char* tokens[] = { "<collada" };
        return SearchFileHeaderForToken(pIOHandler, pFile, tokens, 1);
    }

    return false;
}